

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

char * fmt::v11::detail::parse_arg_id<char,fmt::v11::detail::dynamic_spec_handler<char>>
                 (char *begin,char *end,dynamic_spec_handler<char> *handler)

{
  char c_00;
  basic_string_view<char> id;
  bool bVar1;
  bool bVar2;
  make_unsigned_t<long> count;
  dynamic_spec_handler<char> *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *it;
  int index;
  char c;
  int in_stack_ffffffffffffffbc;
  dynamic_spec_handler<char> *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffdc;
  char *s;
  char *pcVar3;
  char *local_8;
  
  c_00 = *in_RDI;
  if ((c_00 < '0') || ('9' < c_00)) {
    bVar1 = is_name_start<char>(c_00);
    s = in_RDI;
    if (!bVar1) {
      report_error((char *)in_stack_ffffffffffffffc0);
    }
    do {
      in_RDI = in_RDI + 1;
      bVar1 = false;
      if (in_RDI != in_RSI) {
        bVar2 = is_name_start<char>(*in_RDI);
        bVar1 = true;
        if ((!bVar2) && (bVar1 = false, '/' < *in_RDI)) {
          bVar1 = *in_RDI < ':';
        }
      }
    } while (bVar1);
    pcVar3 = s;
    count = to_unsigned<long>((long)in_RDX);
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)&stack0xffffffffffffffc0,s,count);
    id.size_ = (size_t)pcVar3;
    id.data_ = in_RSI;
    dynamic_spec_handler<char>::on_name(in_RDX,id);
    local_8 = in_RDI;
  }
  else {
    if (c_00 == '0') {
      in_RDI = in_RDI + 1;
    }
    else {
      parse_nonnegative_int<char>
                ((char **)((ulong)CONCAT13(c_00,in_stack_ffffffffffffffdc) << 0x20),
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
    if ((in_RDI == in_RSI) || ((*in_RDI != '}' && (*in_RDI != ':')))) {
      report_error((char *)in_stack_ffffffffffffffc0);
    }
    dynamic_spec_handler<char>::on_index(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR auto parse_arg_id(const Char* begin, const Char* end,
                                Handler&& handler) -> const Char* {
  Char c = *begin;
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, INT_MAX);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      report_error("invalid format string");
    else
      handler.on_index(index);
    return begin;
  }
  if (FMT_OPTIMIZE_SIZE > 1 || !is_name_start(c)) {
    report_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(*it) || ('0' <= *it && *it <= '9')));
  handler.on_name({begin, to_unsigned(it - begin)});
  return it;
}